

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ArrayPtr<const_char> kj::_::splitNext(ArrayPtr<const_char> *cursor,char delimiter)

{
  char *pcVar1;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_20;
  
  ArrayPtr<const_char>::findFirst(&local_20,(char *)cursor);
  if ((char)local_20.ptr == '\x01') {
    pcVar1 = cursor->ptr;
    cursor->ptr = pcVar1 + local_20.size_ + 1;
    cursor->size_ = cursor->size_ - (local_20.size_ + 1);
  }
  else {
    pcVar1 = cursor->ptr;
    local_20.size_ = cursor->size_;
    cursor->ptr = (char *)0x0;
    cursor->size_ = 0;
  }
  AVar2.size_ = local_20.size_;
  AVar2.ptr = pcVar1;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const char> splitNext(kj::ArrayPtr<const char>& cursor, char delimiter) {
  // Consumes and returns the next item in a delimited list.
  //
  // If a delimiter is found:
  //  - `cursor` is updated to point to the rest of the string after the delimiter.
  //  - The text before the delimiter is returned.
  // If no delimiter is found:
  //  - `cursor` is updated to an empty string.
  //  - The text that had been in `cursor` is returned.
  //
  // (It's up to the caller to stop the loop once `cursor` is empty.)
  KJ_IF_SOME(index, cursor.findFirst(delimiter)) {
    auto part = cursor.first(index);
    cursor = cursor.slice(index + 1, cursor.size());
    return part;
  }
  kj::ArrayPtr<const char> result(kj::mv(cursor));
  cursor = nullptr;

  return result;
}